

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O0

bool __thiscall
re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  uint cond_00;
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  const_pointer pcVar6;
  LogMessage *pLVar7;
  StringPiece *pSVar8;
  uchar *nodes_00;
  size_type sVar9;
  byte *pbVar10;
  undefined8 *puVar11;
  int in_ECX;
  undefined8 *in_RDX;
  StringPiece *in_RSI;
  Prog *in_RDI;
  int in_R8D;
  long in_R9;
  int in_stack_00000008;
  int i_4;
  int i_3;
  uint32_t matchcond_1;
  int i_2;
  uint32_t nextindex;
  uint32_t cond;
  uint32_t matchcond;
  int c;
  uint32_t nextmatchcond;
  bool matched;
  char *p;
  char *ep;
  char *bp;
  uint8_t *bytemap;
  OneState *state;
  int statesize;
  uint8_t *nodes;
  StringPiece context;
  int i_1;
  char *matchcap [10];
  int i;
  char *cap [10];
  int ncap;
  StringPiece *in_stack_fffffffffffffcd8;
  LogMessage *in_stack_fffffffffffffce0;
  undefined4 local_300;
  int in_stack_fffffffffffffd04;
  char *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  int local_2e4;
  uint local_2d0;
  byte *local_2c8;
  OneState *local_2a8;
  StringPiece local_290;
  int local_27c;
  byte *local_278 [11];
  int local_21c;
  byte *local_218 [11];
  int local_1c0;
  LogMessage local_1b0;
  long local_30;
  int local_28;
  undefined8 *local_20;
  StringPiece *local_18;
  bool local_1;
  
  if ((in_ECX == 1) || (in_R8D == 2)) {
    local_1c0 = in_stack_00000008 << 1;
    if (local_1c0 < 2) {
      local_1c0 = 2;
    }
    local_30 = in_R9;
    local_28 = in_R8D;
    local_20 = in_RDX;
    local_18 = in_RSI;
    for (local_21c = 0; local_21c < local_1c0; local_21c = local_21c + 1) {
      local_218[local_21c] = (byte *)0x0;
    }
    for (local_27c = 0; local_27c < local_1c0; local_27c = local_27c + 1) {
      local_278[local_27c] = (byte *)0x0;
    }
    local_290.data_ = (const_pointer)*local_20;
    local_290.size_ = local_20[1];
    pcVar6 = StringPiece::data(&local_290);
    if (pcVar6 == (const_pointer)0x0) {
      local_290.data_ = local_18->data_;
      local_290.size_ = local_18->size_;
    }
    bVar2 = anchor_start(in_RDI);
    if (bVar2) {
      in_stack_fffffffffffffce0 = (LogMessage *)StringPiece::begin(&local_290);
      pLVar7 = (LogMessage *)StringPiece::begin(local_18);
      if (in_stack_fffffffffffffce0 != pLVar7) {
        return false;
      }
    }
    bVar2 = anchor_end(in_RDI);
    if (bVar2) {
      in_stack_fffffffffffffcd8 = (StringPiece *)StringPiece::end(&local_290);
      pSVar8 = (StringPiece *)StringPiece::end(local_18);
      if (in_stack_fffffffffffffcd8 != pSVar8) {
        return false;
      }
    }
    bVar2 = anchor_end(in_RDI);
    if (bVar2) {
      local_28 = 2;
    }
    nodes_00 = PODArray<unsigned_char>::data((PODArray<unsigned_char> *)0x24750d);
    iVar4 = bytemap_range(in_RDI);
    iVar4 = iVar4 * 4 + 4;
    local_2a8 = IndexToNode(nodes_00,iVar4,0);
    local_2c8 = (byte *)StringPiece::data(local_18);
    pcVar6 = StringPiece::data(local_18);
    sVar9 = StringPiece::size(local_18);
    pbVar10 = (byte *)(pcVar6 + sVar9);
    bVar2 = false;
    local_278[0] = local_2c8;
    local_218[0] = local_2c8;
    local_2d0 = local_2a8->matchcond;
    for (; uVar1 = local_2d0, local_2c8 < pbVar10; local_2c8 = local_2c8 + 1) {
      cond_00 = local_2a8[(long)(int)(uint)in_RDI->bytemap_[(int)(uint)*local_2c8] + 1].matchcond;
      if (((cond_00 & 0x3f) == 0) ||
         (bVar3 = Satisfy((uint32_t)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,pcVar6),
         bVar3)) {
        local_2a8 = IndexToNode(nodes_00,iVar4,cond_00 >> 0x10);
        local_2d0 = local_2a8->matchcond;
      }
      else {
        local_2a8 = (OneState *)0x0;
        local_2d0 = 0x30;
      }
      if ((((local_28 != 2) && (uVar1 != 0x30)) &&
          (((cond_00 & 0x40) != 0 || ((local_2d0 & 0x3f) != 0)))) &&
         (((uVar1 & 0x3f) == 0 ||
          (bVar3 = Satisfy((uint32_t)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,pcVar6),
          bVar3)))) {
        for (local_2e4 = 2;
            SBORROW4(local_2e4,in_stack_00000008 * 2) != local_2e4 + in_stack_00000008 * -2 < 0;
            local_2e4 = local_2e4 + 1) {
          local_278[local_2e4] = local_218[local_2e4];
        }
        if ((1 < in_stack_00000008) && ((uVar1 & 0x7f80) != 0)) {
          ApplyCaptures(uVar1,(char *)local_2c8,(char **)local_278,local_1c0);
        }
        local_278[1] = local_2c8;
        bVar2 = true;
        if ((local_28 == 0) && ((cond_00 & 0x40) != 0)) goto LAB_002478d9;
      }
      if (local_2a8 == (OneState *)0x0) goto LAB_002478d9;
      if (((cond_00 & 0x7f80) != 0) && (1 < in_stack_00000008)) {
        ApplyCaptures(cond_00,(char *)local_2c8,(char **)local_218,local_1c0);
      }
    }
    uVar1 = local_2a8->matchcond;
    if ((uVar1 != 0x30) &&
       (((uVar1 & 0x3f) == 0 ||
        (bVar3 = Satisfy((uint32_t)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,pcVar6),
        bVar3)))) {
      if ((1 < in_stack_00000008) && ((uVar1 & 0x7f80) != 0)) {
        ApplyCaptures(uVar1,(char *)local_2c8,(char **)local_218,local_1c0);
      }
      for (iVar4 = 2; iVar4 < local_1c0; iVar4 = iVar4 + 1) {
        local_278[iVar4] = local_218[iVar4];
      }
      local_278[1] = local_2c8;
      bVar2 = true;
    }
LAB_002478d9:
    if (bVar2) {
      for (iVar4 = 0; iVar4 < in_stack_00000008; iVar4 = iVar4 + 1) {
        StringPiece::StringPiece
                  ((StringPiece *)&local_300,(char *)local_278[iVar4 << 1],
                   (long)local_278[iVar4 * 2 + 1] - (long)local_278[iVar4 << 1]);
        puVar11 = (undefined8 *)(local_30 + (long)iVar4 * 0x10);
        *puVar11 = CONCAT44(in_stack_fffffffffffffd04,local_300);
        puVar11[1] = in_stack_fffffffffffffd08;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08,in_stack_fffffffffffffd04);
    poVar5 = LogMessage::stream(&local_1b0);
    std::operator<<(poVar5,"Cannot use SearchOnePass for unanchored matches.");
    LogMessage::~LogMessage(in_stack_fffffffffffffce0);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.data() == NULL)
    context = text;
  if (anchor_start() && context.begin() != text.begin())
    return false;
  if (anchor_end() && context.end() != text.end())
    return false;
  if (anchor_end())
    kind = kFullMatch;

  uint8_t* nodes = onepass_nodes_.data();
  int statesize = sizeof(OneState) + bytemap_range()*sizeof(uint32_t);
  // start() is always mapped to the zeroth OneState.
  OneState* state = IndexToNode(nodes, statesize, 0);
  uint8_t* bytemap = bytemap_;
  const char* bp = text.data();
  const char* ep = text.data() + text.size();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32_t nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32_t matchcond = nextmatchcond;
    uint32_t cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32_t nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32_t matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i] =
        StringPiece(matchcap[2 * i],
                    static_cast<size_t>(matchcap[2 * i + 1] - matchcap[2 * i]));
  return true;
}